

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool SearchBoundedPlaneXYZHelper
               (ON_RTreeNode *a_node,double *a_bounded_plane,ON_RTreeSearchResultCallback *a_result)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  
  uVar1 = a_node->m_count;
  if (0 < (int)uVar1) {
    if (a_node->m_level < 1) {
      lVar3 = 0;
      do {
        bVar2 = OverlapBoundedPlaneXYZHelper
                          (a_bounded_plane,
                           (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar3));
        if ((bVar2) &&
           (bVar2 = (*a_result->m_resultCallback)
                              (a_result->m_context,
                               *(ON__INT_PTR *)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3)),
           !bVar2)) {
          return false;
        }
        lVar3 = lVar3 + 0x38;
      } while ((ulong)uVar1 * 0x38 - lVar3 != 0);
    }
    else {
      lVar3 = 0;
      do {
        bVar2 = OverlapBoundedPlaneXYZHelper
                          (a_bounded_plane,
                           (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar3));
        if ((bVar2) &&
           (bVar2 = SearchBoundedPlaneXYZHelper
                              (*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3),
                               a_bounded_plane,a_result), !bVar2)) {
          return false;
        }
        lVar3 = lVar3 + 0x38;
      } while ((ulong)uVar1 * 0x38 - lVar3 != 0);
    }
  }
  return true;
}

Assistant:

static
bool SearchBoundedPlaneXYZHelper(const ON_RTreeNode* a_node, const double* a_bounded_plane, ON_RTreeSearchResultCallback& a_result ) 
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapBoundedPlaneXYZHelper(a_bounded_plane, &branch[i].m_rect))
        {
          if(!SearchBoundedPlaneXYZHelper(branch[i].m_child, a_bounded_plane, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapBoundedPlaneXYZHelper(a_bounded_plane, &branch[i].m_rect))
        {
          if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
          {
            // callback canceled search
            return false;
          }
        }
      }
    }
  }

  return true; // Continue searching
}